

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_assign_icc(LodePNGInfo *info,char *name,uchar *profile,uint profile_size)

{
  char *pcVar1;
  void *pvVar2;
  uint in_ECX;
  void *in_RDX;
  char *in_RDI;
  uint local_4;
  
  pcVar1 = alloc_string(in_RDI);
  *(char **)(in_RDI + 0xf0) = pcVar1;
  pvVar2 = lodepng_malloc(0x10624b);
  *(void **)(in_RDI + 0xf8) = pvVar2;
  if ((*(long *)(in_RDI + 0xf0) == 0) || (*(long *)(in_RDI + 0xf8) == 0)) {
    local_4 = 0x53;
  }
  else {
    memcpy(*(void **)(in_RDI + 0xf8),in_RDX,(ulong)in_ECX);
    *(uint *)(in_RDI + 0x100) = in_ECX;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static unsigned lodepng_assign_icc(LodePNGInfo* info, const char* name, const unsigned char* profile, unsigned profile_size)
{
  info->iccp_name = alloc_string(name);
  info->iccp_profile = (unsigned char*)lodepng_malloc(profile_size);

  if(!info->iccp_name || !info->iccp_profile) return 83; /*alloc fail*/

  memcpy(info->iccp_profile, profile, profile_size);
  info->iccp_profile_size = profile_size;

  return 0; /*ok*/
}